

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_whitelist_signature_parse
              (secp256k1_context *ctx,secp256k1_whitelist_signature *sig,uchar *input,
              size_t input_len)

{
  size_t input_len_local;
  uchar *input_local;
  secp256k1_whitelist_signature *sig_local;
  secp256k1_context *ctx_local;
  
  if (sig == (secp256k1_whitelist_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (input == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"input != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (input_len == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    sig->n_keys = (ulong)*input;
    if ((sig->n_keys < 0x100) && (input_len == (sig->n_keys + 1) * 0x20 + 1)) {
      memcpy(sig->data,input + 1,(sig->n_keys + 1) * 0x20);
      ctx_local._4_4_ = 1;
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_whitelist_signature_parse(const secp256k1_context* ctx, secp256k1_whitelist_signature *sig, const unsigned char *input, size_t input_len) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input != NULL);

    if (input_len == 0) {
        return 0;
    }

    sig->n_keys = input[0];
    if (sig->n_keys > MAX_KEYS || input_len != 1 + 32 * (sig->n_keys + 1)) {
        return 0;
    }
    memcpy(&sig->data[0], &input[1], 32 * (sig->n_keys + 1));

    return 1;
}